

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCA.cpp
# Opt level: O2

int main(void)

{
  pointer puVar1;
  network_address_t dst;
  long lVar2;
  Network *this;
  ostream *poVar3;
  int j;
  long lVar4;
  int iVar5;
  unique_ptr<Node,_std::default_delete<Node>_> *node;
  pointer puVar6;
  bool bVar7;
  double dVar8;
  vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
  nodes;
  string str;
  Message request;
  string local_b8;
  Client client;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  Client::Client(&client);
  nodes.
  super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nodes.
  super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  nodes.
  super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar5 = 10;
  while (puVar1 = nodes.
                  super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, bVar7 = iVar5 != 0, iVar5 = iVar5 + -1
        , bVar7) {
    std::make_unique<Node>();
    std::
    vector<std::unique_ptr<Node,std::default_delete<Node>>,std::allocator<std::unique_ptr<Node,std::default_delete<Node>>>>
    ::emplace_back<std::unique_ptr<Node,std::default_delete<Node>>>
              ((vector<std::unique_ptr<Node,std::default_delete<Node>>,std::allocator<std::unique_ptr<Node,std::default_delete<Node>>>>
                *)&nodes,(unique_ptr<Node,_std::default_delete<Node>_> *)&request);
    std::unique_ptr<Node,_std::default_delete<Node>_>::~unique_ptr
              ((unique_ptr<Node,_std::default_delete<Node>_> *)&request);
  }
  for (puVar6 = nodes.
                super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    Node::SetAllNodes((puVar6->_M_t).super___uniq_ptr_impl<Node,_std::default_delete<Node>_>._M_t.
                      super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
                      super__Head_base<0UL,_Node_*,_false>._M_head_impl,&nodes);
  }
  for (iVar5 = 0; iVar5 != 12000; iVar5 = iVar5 + 1) {
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    std::__cxx11::to_string(&local_b8,iVar5);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&request,
                   "Test",&local_b8);
    std::__cxx11::string::operator=((string *)&str,(string *)&request);
    std::__cxx11::string::~string((string *)&request);
    std::__cxx11::string::~string((string *)&local_b8);
    Message::Message(&request,REQUEST);
    request.t = time((time_t *)0x0);
    std::__cxx11::string::_M_assign((string *)&request.o);
    request.c = NetworkNode::GetNodeAddress(&client.super_NetworkNode);
    request.i = request.c;
    Message::diggest_abi_cxx11_(&local_b8,&request);
    std::__cxx11::string::operator=((string *)&request.d,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    Message::str_abi_cxx11_(&local_b8,&request);
    std::__cxx11::string::operator=((string *)&request.m,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
      dst = NetworkNode::GetNodeAddress
                      (&(nodes.
                         super__Vector_base<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar4]._M_t.
                         super___uniq_ptr_impl<Node,_std::default_delete<Node>_>._M_t.
                         super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
                         super__Head_base<0UL,_Node_*,_false>._M_head_impl)->super_NetworkNode);
      Client::SendRequest(&client,dst,&request);
    }
    Message::~Message(&request);
    std::__cxx11::string::~string((string *)&str);
  }
  while( true ) {
    this = Network::instance();
    bVar7 = Network::Empty(this);
    if (bVar7) break;
    request.msg_type = CONFIRM;
    request._4_4_ = 0;
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>
              ((duration<long,_std::ratio<1L,_1L>_> *)&request);
  }
  lVar4 = std::chrono::_V2::system_clock::now();
  std::operator<<((ostream *)&std::cout,"elapsed: ");
  dVar8 = (double)(lVar4 - lVar2) / 1000000000.0;
  poVar3 = std::ostream::_M_insert<double>(dVar8);
  poVar3 = std::operator<<(poVar3," seconds");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,"TPS: ");
  poVar3 = std::ostream::_M_insert<double>(12000.0 / dVar8);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::
  vector<std::unique_ptr<Node,_std::default_delete<Node>_>,_std::allocator<std::unique_ptr<Node,_std::default_delete<Node>_>_>_>
  ::~vector(&nodes);
  Client::~Client(&client);
  return 0;
}

Assistant:

int main()
{
    using namespace std::chrono;
    auto start = system_clock::now();

    Client client;
    std::vector<std::unique_ptr<Node>> nodes;
    for (int i = 0; i < Num_Node; i++)
    {
        nodes.push_back(std::make_unique<Node>());
    }

    for (auto & node : nodes)
    {
        node->SetAllNodes(nodes);
    }
    for(int i = 0; i < NUMOFTRANS; i++)
    {
        std::string str;
        str = "Test"+ to_string(i);
        Message request(Message::REQUEST);
        request.t = std::time(nullptr);
        request.o = str;
        request.c = request.i = client.GetNodeAddress();
        request.d = request.diggest();
        request.m = request.str();
        for(int j = 0; j < Num_Node; j++)
        {
          client.SendRequest(nodes[j]->GetNodeAddress(),request);
        }
    }
    while (!Network::instance().Empty())
        std::this_thread::sleep_for(1s);

    duration<double> diff = system_clock::now() - start;
    cout<<"elapsed: " << diff.count() << " seconds" <<endl;
    cout<<"TPS: " << NUMOFTRANS/diff.count()<<endl;

	return 0;
}